

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::print_to_file
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  long lVar1;
  ostream *poVar2;
  pointer pvVar3;
  size_t i;
  long lVar4;
  size_t j;
  long lVar5;
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)filename);
  poVar2 = std::ostream::_M_insert<double>(this->min_);
  std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<double>(this->max_);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  while( true ) {
    pvVar3 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar4 == ((long)(this->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) break;
    for (lVar5 = 0;
        lVar1 = *(long *)&pvVar3[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data,
        lVar5 != (long)*(pointer *)
                        ((long)&pvVar3[lVar4].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar1 >> 3; lVar5 = lVar5 + 1
        ) {
      poVar2 = std::ostream::_M_insert<double>(*(double *)(lVar1 + lVar5 * 8));
      std::operator<<(poVar2," ");
      pvVar3 = (this->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&out);
    lVar4 = lVar4 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::print_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  // First we store this->min_ and this->max_ values:
  out << this->min_ << " " << this->max_ << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
}